

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void VisitExpressionTreeNodes
               (ExprBase *expression,void *context,_func_void_void_ptr_ExprBase_ptr *accept)

{
  long lVar1;
  TypeBase *pTVar2;
  _func_int *p_Var3;
  SynBase *pSVar4;
  ExprBase *pEVar5;
  ulong uVar6;
  _func_int **pp_Var7;
  
  if (expression != (ExprBase *)0x0) {
    do {
      (*accept)(context,expression);
      switch(expression->typeID) {
      case 0:
        if (expression[1].typeID != 0) {
          uVar6 = 0;
          do {
            VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase[uVar6],context,accept)
            ;
            uVar6 = uVar6 + 1;
          } while (uVar6 < expression[1].typeID);
          return;
        }
        return;
      default:
        goto switchD_00175589_caseD_1;
      case 0xe:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x16:
      case 0x17:
      case 0x1a:
      case 0x1f:
      case 0x34:
      case 0x35:
        lVar1 = 0x30;
        break;
      case 0xf:
        for (pEVar5 = (ExprBase *)expression[1]._vptr_ExprBase; pEVar5 != (ExprBase *)0x0;
            pEVar5 = pEVar5->next) {
          VisitExpressionTreeNodes(pEVar5,context,accept);
        }
        return;
      case 0x14:
      case 0x19:
      case 0x1b:
      case 0x20:
      case 0x31:
      case 0x32:
        VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
      case 0x1e:
      case 0x26:
        lVar1 = 0x38;
        break;
      case 0x18:
      case 0x1c:
      case 0x1d:
      case 0x2f:
        VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
        goto LAB_001755b7;
      case 0x21:
        for (pEVar5 = *(ExprBase **)&expression[1].typeID; pEVar5 != (ExprBase *)0x0;
            pEVar5 = pEVar5->next) {
          VisitExpressionTreeNodes(pEVar5,context,accept);
        }
        return;
      case 0x24:
        VisitExpressionTreeNodes(*(ExprBase **)&expression[1].typeID,context,accept);
        for (pSVar4 = expression[1].source; pSVar4 != (SynBase *)0x0;
            pSVar4 = (SynBase *)(pSVar4->pos).begin) {
          VisitExpressionTreeNodes((ExprBase *)pSVar4,context,accept);
        }
        VisitExpressionTreeNodes(expression[1].next,context,accept);
        for (pEVar5 = *(ExprBase **)&expression[1].listed; pEVar5 != (ExprBase *)0x0;
            pEVar5 = pEVar5->next) {
          VisitExpressionTreeNodes(pEVar5,context,accept);
        }
        return;
      case 0x25:
        for (pEVar5 = *(ExprBase **)&expression[1].typeID; pEVar5 != (ExprBase *)0x0;
            pEVar5 = pEVar5->next) {
          VisitExpressionTreeNodes(pEVar5,context,accept);
        }
        return;
      case 0x27:
        goto switchD_00175589_caseD_27;
      case 0x28:
        for (pp_Var7 = expression[1]._vptr_ExprBase; pp_Var7 != (_func_int **)0x0;
            pp_Var7 = (_func_int **)pp_Var7[2]) {
          VisitExpressionTreeNodes((ExprBase *)pp_Var7[1],context,accept);
        }
        return;
      case 0x29:
        VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
        for (pEVar5 = *(ExprBase **)&expression[1].typeID; pEVar5 != (ExprBase *)0x0;
            pEVar5 = pEVar5->next) {
          VisitExpressionTreeNodes(pEVar5,context,accept);
        }
        return;
      case 0x2c:
        for (pEVar5 = (ExprBase *)expression[1]._vptr_ExprBase[0x19]; pEVar5 != (ExprBase *)0x0;
            pEVar5 = pEVar5->next) {
          VisitExpressionTreeNodes(pEVar5,context,accept);
        }
        return;
      case 0x2d:
        for (pTVar2 = expression[1].type; pTVar2 != (TypeBase *)0x0;
            pTVar2 = (TypeBase *)pTVar2->importModule) {
          VisitExpressionTreeNodes((ExprBase *)pTVar2,context,accept);
        }
        for (p_Var3 = expression[1]._vptr_ExprBase[0xf]; p_Var3 != (_func_int *)0x0;
            p_Var3 = *(_func_int **)(p_Var3 + 0x10)) {
          VisitExpressionTreeNodes(*(ExprBase **)(p_Var3 + 8),context,accept);
        }
        return;
      case 0x2e:
        for (p_Var3 = expression[1]._vptr_ExprBase[0xf]; p_Var3 != (_func_int *)0x0;
            p_Var3 = *(_func_int **)(p_Var3 + 0x10)) {
          VisitExpressionTreeNodes(*(ExprBase **)(p_Var3 + 8),context,accept);
        }
LAB_001755b7:
        VisitExpressionTreeNodes(*(ExprBase **)&expression[1].typeID,context,accept);
switchD_00175589_caseD_27:
        lVar1 = 0x40;
        break;
      case 0x30:
        VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
        VisitExpressionTreeNodes(*(ExprBase **)&expression[1].typeID,context,accept);
        VisitExpressionTreeNodes((ExprBase *)expression[1].source,context,accept);
        lVar1 = 0x48;
        break;
      case 0x33:
        VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase,context,accept);
        for (pEVar5 = *(ExprBase **)&expression[1].typeID; pEVar5 != (ExprBase *)0x0;
            pEVar5 = pEVar5->next) {
          VisitExpressionTreeNodes(pEVar5,context,accept);
        }
        lVar1 = 0x58;
        for (pTVar2 = expression[1].type; pTVar2 != (TypeBase *)0x0;
            pTVar2 = (TypeBase *)pTVar2->importModule) {
          VisitExpressionTreeNodes((ExprBase *)pTVar2,context,accept);
        }
        break;
      case 0x36:
        lVar1 = 0x40;
        for (pEVar5 = (ExprBase *)expression[1]._vptr_ExprBase; pEVar5 != (ExprBase *)0x0;
            pEVar5 = pEVar5->next) {
          VisitExpressionTreeNodes(pEVar5,context,accept);
        }
        break;
      case 0x37:
        if (expression[1].typeID != 0) {
          uVar6 = 0;
          do {
            VisitExpressionTreeNodes((ExprBase *)expression[1]._vptr_ExprBase[uVar6],context,accept)
            ;
            uVar6 = uVar6 + 1;
          } while (uVar6 < expression[1].typeID);
          return;
        }
        return;
      case 0x38:
        for (pEVar5 = (ExprBase *)expression[7]._vptr_ExprBase; pEVar5 != (ExprBase *)0x0;
            pEVar5 = pEVar5->next) {
          VisitExpressionTreeNodes(pEVar5,context,accept);
        }
        for (pSVar4 = expression[7].source; pSVar4 != (SynBase *)0x0;
            pSVar4 = (SynBase *)(pSVar4->pos).begin) {
          VisitExpressionTreeNodes((ExprBase *)pSVar4,context,accept);
        }
        return;
      }
      expression = *(ExprBase **)((long)&expression->_vptr_ExprBase + lVar1);
      if (expression == (ExprBase *)0x0) {
        return;
      }
    } while( true );
  }
switchD_00175589_caseD_1:
  return;
}

Assistant:

void VisitExpressionTreeNodes(ExprBase *expression, void *context, void(*accept)(void *context, ExprBase *child))
{
	if(!expression)
		return;

	accept(context, expression);

	if(ExprError *node = getType<ExprError>(expression))
	{
		for(unsigned i = 0; i < node->values.size(); i++)
			VisitExpressionTreeNodes(node->values[i], context, accept);
	}
	else if(ExprPassthrough *node = getType<ExprPassthrough>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprArray *node = getType<ExprArray>(expression))
	{
		for(ExprBase *value = node->values.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprPreModify *node = getType<ExprPreModify>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprPostModify *node = getType<ExprPostModify>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprTypeCast *node = getType<ExprTypeCast>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprUnaryOp *node = getType<ExprUnaryOp>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprBinaryOp *node = getType<ExprBinaryOp>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->rhs, context, accept);
	}
	else if(ExprDereference *node = getType<ExprDereference>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprUnboxing *node = getType<ExprUnboxing>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprConditional *node = getType<ExprConditional>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->trueBlock, context, accept);
		VisitExpressionTreeNodes(node->falseBlock, context, accept);
	}
	else if(ExprAssignment *node = getType<ExprAssignment>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->rhs, context, accept);
	}
	else if(ExprMemberAccess *node = getType<ExprMemberAccess>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprArrayIndex *node = getType<ExprArrayIndex>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
		VisitExpressionTreeNodes(node->index, context, accept);
	}
	else if(ExprReturn *node = getType<ExprReturn>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateUpdate, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprYield *node = getType<ExprYield>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateUpdate, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprVariableDefinition *node = getType<ExprVariableDefinition>(expression))
	{
		VisitExpressionTreeNodes(node->initializer, context, accept);
	}
	else if(ExprZeroInitialize *node = getType<ExprZeroInitialize>(expression))
	{
		VisitExpressionTreeNodes(node->address, context, accept);
	}
	else if(ExprArraySetup *node = getType<ExprArraySetup>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->initializer, context, accept);
	}
	else if(ExprVariableDefinitions *node = getType<ExprVariableDefinitions>(expression))
	{
		for(ExprBase *value = node->definitions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(expression))
	{
		VisitExpressionTreeNodes(node->contextArgument, context, accept);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateRead, context, accept);

		for(ExprBase *expr = node->expressions.head; expr; expr = expr->next)
			VisitExpressionTreeNodes(expr, context, accept);
	}
	else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(expression))
	{
		for(ExprBase *expr = node->contextVariables.head; expr; expr = expr->next)
			VisitExpressionTreeNodes(expr, context, accept);
	}
	else if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(expression))
	{
		VisitExpressionTreeNodes(node->context, context, accept);
	}
	else if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(expression))
	{
		VisitExpressionTreeNodes(node->context, context, accept);
	}
	else if(ExprShortFunctionOverloadSet *node = getType<ExprShortFunctionOverloadSet>(expression))
	{
		for(ShortFunctionHandle *arg = node->functions.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg->context, context, accept);
	}
	else if(ExprFunctionCall *node = getType<ExprFunctionCall>(expression))
	{
		VisitExpressionTreeNodes(node->function, context, accept);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg, context, accept);
	}
	else if(ExprGenericClassPrototype *node = getType<ExprGenericClassPrototype>(expression))
	{
		for(ExprBase *value = node->genericProtoType->instances.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprClassDefinition *node = getType<ExprClassDefinition>(expression))
	{
		for(ExprBase *value = node->functions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ConstantData *value = node->classType->constants.head; value; value = value->next)
			VisitExpressionTreeNodes(value->value, context, accept);
	}
	else if(ExprEnumDefinition *node = getType<ExprEnumDefinition>(expression))
	{
		for(ConstantData *value = node->enumType->constants.head; value; value = value->next)
			VisitExpressionTreeNodes(value->value, context, accept);

		VisitExpressionTreeNodes(node->toInt, context, accept);
		VisitExpressionTreeNodes(node->toEnum, context, accept);
	}
	else if(ExprIfElse *node = getType<ExprIfElse>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->trueBlock, context, accept);
		VisitExpressionTreeNodes(node->falseBlock, context, accept);
	}
	else if(ExprFor *node = getType<ExprFor>(expression))
	{
		VisitExpressionTreeNodes(node->initializer, context, accept);
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->increment, context, accept);
		VisitExpressionTreeNodes(node->body, context, accept);
	}
	else if(ExprWhile *node = getType<ExprWhile>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->body, context, accept);
	}
	else if(ExprDoWhile *node = getType<ExprDoWhile>(expression))
	{
		VisitExpressionTreeNodes(node->body, context, accept);
		VisitExpressionTreeNodes(node->condition, context, accept);
	}
	else if(ExprSwitch *node = getType<ExprSwitch>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);

		for(ExprBase *value = node->cases.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ExprBase *value = node->blocks.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		VisitExpressionTreeNodes(node->defaultBlock, context, accept);
	}
	else if(ExprBreak *node = getType<ExprBreak>(expression))
	{
		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprContinue *node = getType<ExprContinue>(expression))
	{
		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprBlock *node = getType<ExprBlock>(expression))
	{
		for(ExprBase *value = node->expressions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprSequence *node = getType<ExprSequence>(expression))
	{
		for(unsigned i = 0; i < node->expressions.size(); i++)
			VisitExpressionTreeNodes(node->expressions[i], context, accept);
	}
	else if(ExprModule *node = getType<ExprModule>(expression))
	{
		for(ExprBase *value = node->setup.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
}